

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Split.hpp
# Opt level: O0

tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* CLI::detail::get_names
            (tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *input)

{
  bool bVar1;
  reference pbVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  BadNameString *pBVar6;
  bool local_1e1;
  string local_198;
  undefined1 local_171;
  string local_170;
  undefined1 local_149;
  string local_148;
  string local_128 [39];
  byte local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_d9;
  string local_d8;
  int local_b4 [5];
  undefined1 local_a0 [8];
  string name;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string pos_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  long_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  short_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *input_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&long_names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&pos_name.field_2 + 8));
  ::std::__cxx11::string::string((string *)&__range2);
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(input);
  name.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(input);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&name.field_2 + 8));
    if (!bVar1) {
      std::
      tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true,_true>
                (__return_storage_ptr__,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&long_names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&pos_name.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2);
      local_b4[1] = 1;
      ::std::__cxx11::string::~string((string *)&__range2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&pos_name.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&long_names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return __return_storage_ptr__;
    }
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
    ::std::__cxx11::string::string((string *)local_a0,(string *)pbVar2);
    lVar3 = ::std::__cxx11::string::length();
    if (lVar3 == 0) {
      local_b4[1] = 3;
    }
    else {
      uVar4 = ::std::__cxx11::string::length();
      if (((uVar4 < 2) ||
          (pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_a0), *pcVar5 != '-')) ||
         (pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_a0), *pcVar5 == '-')) {
        uVar4 = ::std::__cxx11::string::length();
        local_101 = 0;
        local_1e1 = false;
        if (2 < uVar4) {
          ::std::__cxx11::string::substr((ulong)&local_100,(ulong)local_a0);
          local_101 = 1;
          local_1e1 = ::std::operator==(&local_100,"--");
        }
        if ((local_101 & 1) != 0) {
          ::std::__cxx11::string::~string((string *)&local_100);
        }
        if (local_1e1 == false) {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_a0,"-");
          if ((bVar1) ||
             (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_a0,"--"), bVar1)) {
            local_171 = 1;
            pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string((string *)&local_170,(string *)local_a0);
            BadNameString::DashesOnly(pBVar6,&local_170);
            local_171 = 0;
            __cxa_throw(pBVar6,&BadNameString::typeinfo,BadNameString::~BadNameString);
          }
          lVar3 = ::std::__cxx11::string::length();
          if (lVar3 != 0) {
            pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string((string *)&local_198,(string *)local_a0);
            BadNameString::MultiPositionalNames(pBVar6,&local_198);
            __cxa_throw(pBVar6,&BadNameString::typeinfo,BadNameString::~BadNameString);
          }
          ::std::__cxx11::string::operator=((string *)&__range2,(string *)local_a0);
        }
        else {
          ::std::__cxx11::string::substr((ulong)local_128,(ulong)local_a0);
          ::std::__cxx11::string::operator=((string *)local_a0,local_128);
          ::std::__cxx11::string::~string(local_128);
          bVar1 = valid_name_string((string *)local_a0);
          if (!bVar1) {
            local_149 = 1;
            pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string((string *)&local_148,(string *)local_a0);
            BadNameString::BadLongName(pBVar6,&local_148);
            local_149 = 0;
            __cxa_throw(pBVar6,&BadNameString::typeinfo,BadNameString::~BadNameString);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&pos_name.field_2 + 8),(value_type *)local_a0);
        }
      }
      else {
        lVar3 = ::std::__cxx11::string::length();
        if (lVar3 != 2) {
LAB_0010d724:
          local_d9 = 1;
          pBVar6 = (BadNameString *)__cxa_allocate_exception(0x38);
          ::std::__cxx11::string::string((string *)&local_d8,(string *)local_a0);
          BadNameString::OneCharName(pBVar6,&local_d8);
          local_d9 = 0;
          __cxa_throw(pBVar6,&BadNameString::typeinfo,BadNameString::~BadNameString);
        }
        pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_a0);
        bVar1 = valid_first_char<char>(*pcVar5);
        if (!bVar1) goto LAB_0010d724;
        local_b4[0] = 1;
        pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)local_a0);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<int,char&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &long_names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_b4,pcVar5);
      }
      local_b4[1] = 0;
    }
    ::std::__cxx11::string::~string((string *)local_a0);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

inline std::tuple<std::vector<std::string>, std::vector<std::string>, std::string>
get_names(const std::vector<std::string> &input) {

    std::vector<std::string> short_names;
    std::vector<std::string> long_names;
    std::string pos_name;

    for(std::string name : input) {
        if(name.length() == 0)
            continue;
        else if(name.length() > 1 && name[0] == '-' && name[1] != '-') {
            if(name.length() == 2 && valid_first_char(name[1]))
                short_names.emplace_back(1, name[1]);
            else
                throw BadNameString::OneCharName(name);
        } else if(name.length() > 2 && name.substr(0, 2) == "--") {
            name = name.substr(2);
            if(valid_name_string(name))
                long_names.push_back(name);
            else
                throw BadNameString::BadLongName(name);
        } else if(name == "-" || name == "--") {
            throw BadNameString::DashesOnly(name);
        } else {
            if(pos_name.length() > 0)
                throw BadNameString::MultiPositionalNames(name);
            pos_name = name;
        }
    }

    return std::tuple<std::vector<std::string>, std::vector<std::string>, std::string>(
        short_names, long_names, pos_name);
}